

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionSystemBullet::ReportProximities
          (ChCollisionSystemBullet *this,ChProximityContainer *mproximitycontainer)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  
  (*(mproximitycontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(mproximitycontainer);
  iVar1 = (*this->bt_collision_world->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[9])();
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))
                    ((long *)CONCAT44(extraout_var,iVar1));
  if (0 < (int)uVar2) {
    lVar4 = 0;
    do {
      iVar1 = (*this->bt_collision_world->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[9])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x38))
                        ((long *)CONCAT44(extraout_var_00,iVar1));
      (*(mproximitycontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3f])
                (mproximitycontainer,
                 *(undefined8 *)(**(long **)(*(long *)(lVar3 + 0x10) + lVar4) + 0x118),
                 *(undefined8 *)(**(long **)(*(long *)(lVar3 + 0x10) + 8 + lVar4) + 0x118));
      lVar4 = lVar4 + 0x20;
    } while ((ulong)uVar2 << 5 != lVar4);
  }
  (*(mproximitycontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x40])(mproximitycontainer);
  return;
}

Assistant:

void ChCollisionSystemBullet::ReportProximities(ChProximityContainer* mproximitycontainer) {
    mproximitycontainer->BeginAddProximities();

    int numPairs = bt_collision_world->getBroadphase()->getOverlappingPairCache()->getNumOverlappingPairs();
    for (int i = 0; i < numPairs; i++) {
        cbtBroadphasePair mp =
            bt_collision_world->getBroadphase()->getOverlappingPairCache()->getOverlappingPairArray().at(i);

        cbtCollisionObject* obA = static_cast<cbtCollisionObject*>(mp.m_pProxy0->m_clientObject);
        cbtCollisionObject* obB = static_cast<cbtCollisionObject*>(mp.m_pProxy1->m_clientObject);

        ChCollisionModel* modelA = (ChCollisionModel*)obA->getUserPointer();
        ChCollisionModel* modelB = (ChCollisionModel*)obB->getUserPointer();

        // Add to proximity container
        mproximitycontainer->AddProximity(modelA, modelB);
    }
    mproximitycontainer->EndAddProximities();
}